

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_GetFontOffsetForIndex_internal(uchar *font_collection,int index)

{
  int iVar1;
  stbtt_uint32 sVar2;
  stbtt_int32 sVar3;
  stbtt_int32 n;
  int index_local;
  uchar *font_collection_local;
  
  iVar1 = stbtt__isfont(font_collection);
  if (iVar1 == 0) {
    if ((((*font_collection == 't') && (font_collection[1] == 't')) && (font_collection[2] == 'c'))
       && ((font_collection[3] == 'f' &&
           ((sVar2 = ttULONG(font_collection + 4), sVar2 == 0x10000 ||
            (sVar2 = ttULONG(font_collection + 4), sVar2 == 0x20000)))))) {
      sVar3 = ttLONG(font_collection + 8);
      if (index < sVar3) {
        font_collection_local._4_4_ = ttULONG(font_collection + (long)(index << 2) + 0xc);
      }
      else {
        font_collection_local._4_4_ = 0xffffffff;
      }
    }
    else {
      font_collection_local._4_4_ = 0xffffffff;
    }
  }
  else {
    font_collection_local._4_4_ = 0xffffffff;
    if (index == 0) {
      font_collection_local._4_4_ = 0;
    }
  }
  return font_collection_local._4_4_;
}

Assistant:

static int stbtt_GetFontOffsetForIndex_internal(unsigned char *font_collection, int index)
{
   // if it's just a font, there's only one valid index
   if (stbtt__isfont(font_collection))
      return index == 0 ? 0 : -1;

   // check if it's a TTC
   if (stbtt_tag(font_collection, "ttcf")) {
      // version 1?
      if (ttULONG(font_collection+4) == 0x00010000 || ttULONG(font_collection+4) == 0x00020000) {
         stbtt_int32 n = ttLONG(font_collection+8);
         if (index >= n)
            return -1;
         return ttULONG(font_collection+12+index*4);
      }
   }
   return -1;
}